

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex5_led_blinking.c
# Opt level: O2

void sub_task_set_low(s_awaiter_t *__awaiter_dummy__,void *arg)

{
  while (g_exit == false) {
    g_is_low = true;
    puts("LED = 0");
    puts("LED2 = 1");
    s_task_sleep(__awaiter_dummy__,1);
    g_is_low = false;
    puts("LED2 = 0");
    s_task_sleep(__awaiter_dummy__,3);
  }
  return;
}

Assistant:

void sub_task_set_low(__async__, void* arg) {
    (void)arg;
    while(!g_exit) {
        g_is_low = true;                     /* stop fast blinking */
        LED_SET_LOW();                       /* turn the LED off */
#ifdef LED2_SET_HIGH
        LED2_SET_HIGH();                     /* turn the 2nd LED on */
#endif
        s_task_sleep(__await__, 1);          /* wait for 1 second */
        g_is_low = false;                    /* start fast blinking */
#ifdef LED2_SET_LOW
        LED2_SET_LOW();                      /* turn the 2nd LED off */
#endif
        s_task_sleep(__await__, 3);          /* wait for 3 seconds */
    }
}